

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation_Management_Header.cpp
# Opt level: O0

KDataStream * __thiscall
KDIS::PDU::Simulation_Management_Header::Encode
          (KDataStream *__return_storage_ptr__,Simulation_Management_Header *this)

{
  Simulation_Management_Header *this_local;
  KDataStream *stream;
  
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Encode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream Simulation_Management_Header::Encode() const
{
    KDataStream stream;

    Simulation_Management_Header::Encode( stream );

    return stream;
}